

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwap.cpp
# Opt level: O3

int __thiscall
NaPNSwapper::verify(NaPNSwapper *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                   size_t tbslen)

{
  int iVar1;
  int iVar2;
  NaVector *pNVar3;
  
  pNVar3 = NaPetriCnOutput::data(&this->out);
  iVar1 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
  pNVar3 = NaPetriCnInput::data(&this->in);
  iVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
  if (iVar1 == iVar2) {
    pNVar3 = NaPetriCnInput::data(&this->in2);
    iVar1 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
    pNVar3 = NaPetriCnInput::data(&this->in);
    iVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
    if (iVar1 == iVar2) {
      pNVar3 = NaPetriCnOutput::data(&this->out2);
      iVar1 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
      pNVar3 = NaPetriCnInput::data(&this->in2);
      iVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
      if (iVar1 == iVar2) {
        pNVar3 = NaPetriCnInput::data(&this->turn);
        iVar1 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
        return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 1);
      }
    }
  }
  return 0;
}

Assistant:

bool
NaPNSwapper::verify ()
{
    return out.data().dim() == in.data().dim()
        && in2.data().dim() == in.data().dim()
        && out2.data().dim() == in2.data().dim()
        && turn.data().dim() == 1;
}